

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxxopts.hpp
# Opt level: O0

void __thiscall
cxxopts::OptionDetails::OptionDetails
          (OptionDetails *this,string *short_,string *long_,String *desc,
          shared_ptr<const_cxxopts::Value> *val)

{
  string *in_RCX;
  string *in_RDX;
  string *in_RSI;
  string *in_RDI;
  shared_ptr<const_cxxopts::Value> *in_R8;
  string *this_00;
  
  this_00 = in_RDI;
  std::__cxx11::string::string(in_RDI,in_RSI);
  std::__cxx11::string::string(in_RDI + 0x20,in_RDX);
  std::__cxx11::string::string(this_00 + 0x40,in_RCX);
  std::shared_ptr<const_cxxopts::Value>::shared_ptr
            ((shared_ptr<const_cxxopts::Value> *)this_00,in_R8);
  *(undefined4 *)(this_00 + 0x70) = 0;
  return;
}

Assistant:

OptionDetails
                (
                        const std::string& short_,
                        const std::string& long_,
                        const String& desc,
                        std::shared_ptr<const Value> val
                )
                : m_short(short_)
                , m_long(long_)
                , m_desc(desc)
                , m_value(val)
                , m_count(0)
        {
        }